

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::rleUncompress(int inLength,int maxLength,char *in,char *out)

{
  int iVar1;
  void *in_RCX;
  char *in_RDX;
  int in_ESI;
  int in_EDI;
  int count_1;
  int count;
  char *outStart;
  void *local_20;
  char *local_18;
  int local_c;
  int local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  do {
    if (local_8 < 1) {
      return (int)local_20 - (int)in_RCX;
    }
    if (*local_18 < '\0') {
      iVar1 = -(int)*local_18;
      local_8 = local_8 - (iVar1 + 1);
      local_c = local_c + *local_18;
      if ((local_c < 0) || (local_8 < 0)) {
        return 0;
      }
      memcpy(local_20,local_18 + 1,(long)iVar1);
      local_18 = local_18 + 1 + iVar1;
    }
    else {
      iVar1 = (int)*local_18;
      local_8 = local_8 + -2;
      local_c = local_c - (iVar1 + 1);
      if (local_c < 0) {
        return 0;
      }
      memset(local_20,(uint)(byte)local_18[1],(long)(iVar1 + 1));
      iVar1 = iVar1 + 1;
      local_18 = local_18 + 2;
    }
    local_20 = (void *)((long)local_20 + (long)iVar1);
  } while( true );
}

Assistant:

static int rleUncompress(int inLength, int maxLength, const signed char in[],
                         char out[]) {
  char *outStart = out;

  while (inLength > 0) {
    if (*in < 0) {
      int count = -(static_cast<int>(*in++));
      inLength -= count + 1;

      // Fixes #116: Add bounds check to in buffer.
      if ((0 > (maxLength -= count)) || (inLength < 0)) return 0;

      memcpy(out, in, count);
      out += count;
      in += count;
    } else {
      int count = *in++;
      inLength -= 2;

      if (0 > (maxLength -= count + 1)) return 0;

      memset(out, *reinterpret_cast<const char *>(in), count + 1);
      out += count + 1;

      in++;
    }
  }

  return static_cast<int>(out - outStart);
}